

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImGuiContext *pIVar5;
  long lVar6;
  char cVar7;
  ImGuiItemStatusFlags *pIVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImRect local_30;
  ImVec2 local_20;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar4 = (GImGui->GroupStack).Data;
  lVar6 = (long)(GImGui->GroupStack).Size;
  local_30.Min = pIVar4[lVar6 + -1].BackupCursorPos;
  IVar1 = (pIVar3->DC).CursorMaxPos;
  fVar14 = pIVar4[lVar6 + -1].BackupCursorPos.x;
  fVar15 = pIVar4[lVar6 + -1].BackupCursorPos.y;
  fVar12 = IVar1.x;
  fVar13 = IVar1.y;
  uVar10 = -(uint)(fVar14 <= fVar12);
  uVar11 = -(uint)(fVar15 <= fVar13);
  local_30.Max = (ImVec2)(CONCAT44(~uVar11 & (uint)fVar15,~uVar10 & (uint)fVar14) |
                         CONCAT44((uint)fVar13 & uVar11,(uint)fVar12 & uVar10));
  (pIVar3->DC).CursorPos = local_30.Min;
  fVar14 = pIVar4[lVar6 + -1].BackupCursorMaxPos.x;
  fVar15 = pIVar4[lVar6 + -1].BackupCursorMaxPos.y;
  uVar10 = -(uint)(fVar12 <= fVar14);
  uVar11 = -(uint)(fVar13 <= fVar15);
  (pIVar3->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar11 & (uint)fVar13,~uVar10 & (uint)fVar12) |
               CONCAT44((uint)fVar15 & uVar11,(uint)fVar14 & uVar10));
  (pIVar3->DC).Indent.x = pIVar4[lVar6 + -1].BackupIndent.x;
  (pIVar3->DC).GroupOffset.x = pIVar4[lVar6 + -1].BackupGroupOffset.x;
  (pIVar3->DC).CurrLineSize = pIVar4[lVar6 + -1].BackupCurrLineSize;
  fVar12 = pIVar4[lVar6 + -1].BackupCurrLineTextBaseOffset;
  (pIVar3->DC).CurrLineTextBaseOffset = fVar12;
  if (pIVar5->LogEnabled == true) {
    pIVar5->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar4[lVar6 + -1].EmitItem != true) goto LAB_001234e2;
  fVar13 = (pIVar3->DC).PrevLineTextBaseOffset;
  uVar10 = -(uint)(fVar12 <= fVar13);
  (pIVar3->DC).CurrLineTextBaseOffset = (float)(~uVar10 & (uint)fVar12 | (uint)fVar13 & uVar10);
  local_20.x = local_30.Max.x - local_30.Min.x;
  local_20.y = local_30.Max.y - local_30.Min.y;
  ItemSize(&local_20,-1.0);
  ItemAdd(&local_30,0,(ImRect *)0x0);
  IVar2 = pIVar5->ActiveId;
  if (pIVar4[lVar6 + -1].BackupActiveIdIsAlive == IVar2) {
    if ((pIVar4[lVar6 + -1].BackupActiveIdPreviousFrameIsAlive != false) ||
       (pIVar5->ActiveIdPreviousFrameIsAlive == false)) goto LAB_001234cd;
LAB_00123483:
    (pIVar3->DC).LastItemId = pIVar5->ActiveIdPreviousFrame;
    (pIVar3->DC).LastItemRect.Min = local_30.Min;
    (pIVar3->DC).LastItemRect.Max = local_30.Max;
    uVar10 = (pIVar3->DC).LastItemStatusFlags;
    (pIVar3->DC).LastItemStatusFlags = uVar10 | 0x20;
LAB_001234b7:
    if (pIVar5->ActiveId != pIVar5->ActiveIdPreviousFrame) {
      (pIVar3->DC).LastItemStatusFlags = uVar10 | 0x60;
    }
  }
  else {
    bVar9 = pIVar5->ActiveIdIsAlive == IVar2;
    if (pIVar4[lVar6 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar7 = pIVar5->ActiveIdPreviousFrameIsAlive;
      if (IVar2 != 0 && bVar9) goto LAB_00123435;
      if ((bool)cVar7 != false) goto LAB_00123483;
    }
    else if (IVar2 != 0 && bVar9) {
      cVar7 = '\0';
LAB_00123435:
      (pIVar3->DC).LastItemId = IVar2;
      (pIVar3->DC).LastItemRect.Min = local_30.Min;
      (pIVar3->DC).LastItemRect.Max = local_30.Max;
      uVar10 = (pIVar3->DC).LastItemStatusFlags;
      pIVar8 = &(pIVar3->DC).LastItemStatusFlags;
      if (pIVar5->ActiveIdHasBeenEditedThisFrame == true) {
        *pIVar8 = uVar10 | 0x24;
        if (cVar7 == '\0') goto LAB_001234e2;
        uVar10 = uVar10 | 4;
      }
      else {
        *pIVar8 = uVar10 | 0x20;
        if (cVar7 == '\0') goto LAB_001234e2;
      }
      goto LAB_001234b7;
    }
LAB_001234cd:
    (pIVar3->DC).LastItemRect.Min = local_30.Min;
    (pIVar3->DC).LastItemRect.Max = local_30.Max;
    pIVar8 = &(pIVar3->DC).LastItemStatusFlags;
    *(byte *)pIVar8 = (byte)*pIVar8 | 0x20;
  }
LAB_001234e2:
  (pIVar5->GroupStack).Size = (pIVar5->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}